

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

BigInteger * __thiscall
Algorithms::discreteLog
          (BigInteger *__return_storage_ptr__,Algorithms *this,BigInteger *a,BigInteger *b,
          BigInteger *m)

{
  bool bVar1;
  long lVar2;
  longlong lVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  ostream *this_00;
  double in_XMM0_Qa;
  BigInteger local_1e8;
  BigInteger local_1c8;
  uint local_1a4;
  BigInteger local_1a0;
  byte local_17d;
  int local_17c;
  undefined1 local_178 [4];
  int i_1;
  BigInteger local_158;
  BigInteger local_138;
  int local_114;
  undefined1 local_110 [4];
  int i;
  map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
  mp;
  BigInteger cur_a;
  BigInteger A;
  BigInteger local_90;
  BigInteger local_70;
  undefined1 local_50 [8];
  BigInteger n;
  BigInteger *m_local;
  BigInteger *b_local;
  BigInteger *a_local;
  Algorithms *this_local;
  BigInteger *ans;
  
  n._24_8_ = m;
  BigIntegerLibrary::sqrt((BigIntegerLibrary *)&local_90,in_XMM0_Qa);
  BigIntegerLibrary::BigInteger::operator+(&local_70,&local_90,1);
  BigIntegerLibrary::BigInteger::operator/((BigInteger *)local_50,&local_70,100);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_70);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_90);
  BigIntegerLibrary::powm((BigInteger *)&cur_a.isNegative,a,(BigInteger *)local_50,m);
  BigIntegerLibrary::BigInteger::BigInteger
            ((BigInteger *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (BigInteger *)&cur_a.isNegative);
  std::
  map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
  ::map((map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
         *)local_110);
  for (local_114 = 1; lVar2 = (long)local_114,
      lVar3 = BigIntegerLibrary::BigInteger::to_int((BigInteger *)local_50), lVar2 <= lVar3;
      local_114 = local_114 + 1) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_138,(long)local_114);
    pmVar4 = std::
             map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
             ::operator[]((map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
                           *)local_110,
                          (key_type *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
    BigIntegerLibrary::BigInteger::operator=(pmVar4,&local_138);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_138);
    BigIntegerLibrary::BigInteger::operator*
              ((BigInteger *)local_178,
               (BigInteger *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (BigInteger *)&cur_a.isNegative);
    BigIntegerLibrary::BigInteger::operator%(&local_158,(BigInteger *)local_178,m);
    BigIntegerLibrary::BigInteger::operator=
              ((BigInteger *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_158);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_158);
    BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_178);
  }
  BigIntegerLibrary::BigInteger::operator=
            ((BigInteger *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,b);
  for (local_17c = 0; lVar2 = (long)local_17c,
      lVar3 = BigIntegerLibrary::BigInteger::to_int((BigInteger *)local_50), lVar2 < lVar3;
      local_17c = local_17c + 1) {
    sVar5 = std::
            map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
            ::count((map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
                     *)local_110,(key_type *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar5 != 0) {
      local_17d = 0;
      pmVar4 = std::
               map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
               ::operator[]((map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
                             *)local_110,
                            (key_type *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      BigIntegerLibrary::BigInteger::operator*(&local_1a0,pmVar4,(BigInteger *)local_50);
      BigIntegerLibrary::BigInteger::operator-(__return_storage_ptr__,&local_1a0,(long)local_17c);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_1a0);
      bVar1 = BigIntegerLibrary::BigInteger::operator<(__return_storage_ptr__,m);
      if (bVar1) {
        local_17d = 1;
      }
      local_1a4 = (uint)bVar1;
      if ((local_17d & 1) == 0) {
        BigIntegerLibrary::BigInteger::~BigInteger(__return_storage_ptr__);
      }
      if (local_1a4 != 0) goto LAB_0010d40b;
    }
    BigIntegerLibrary::BigInteger::operator*
              (&local_1e8,(BigInteger *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,a);
    BigIntegerLibrary::BigInteger::operator%(&local_1c8,&local_1e8,m);
    BigIntegerLibrary::BigInteger::operator=
              ((BigInteger *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_1c8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_1c8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_1e8);
  }
  this_00 = BigIntegerLibrary::operator<<((ostream *)&std::cout,(BigInteger *)local_50);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  BigIntegerLibrary::BigInteger::BigInteger(__return_storage_ptr__,-1);
  local_1a4 = 1;
LAB_0010d40b:
  std::
  map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
  ::~map((map<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_std::less<BigIntegerLibrary::BigInteger>,_std::allocator<std::pair<const_BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>_>_>
          *)local_110);
  BigIntegerLibrary::BigInteger::~BigInteger
            ((BigInteger *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&cur_a.isNegative);
  BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_50);
  return __return_storage_ptr__;
}

Assistant:

BigInteger Algorithms::discreteLog(BigInteger a, BigInteger b, BigInteger m) {
    BigInteger n = (sqrt(m) + 1) / 100;
    BigInteger A = powm(a, n, m);
    BigInteger cur_a = A;
    map<BigInteger, BigInteger> mp;
    for (int i = 1; i <= n.to_int(); ++i) {
        mp[cur_a] = i;
        cur_a = (cur_a * A) % m;
    }
    cur_a = b;
    for (int i = 0; i < n.to_int(); ++i) {
        if (mp.count(cur_a)) {
            BigInteger ans = mp[cur_a] * n - i;
            if (ans < m) {
                return ans;
            }
        }
        cur_a = (cur_a * a) % m;
    }
    cout << n << endl;
    return -1;
}